

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O1

bool __thiscall RenX::Server::smodePlayer(Server *this,PlayerInfo *player)

{
  ssize_t sVar1;
  size_t in_RCX;
  int in_R8D;
  string local_30;
  
  string_printf_abi_cxx11_(&local_30,"smode pid%d",(ulong)(uint)player->id);
  sVar1 = send(this,(int)local_30._M_string_length,local_30._M_dataplus._M_p,in_RCX,in_R8D);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (int)sVar1 != 0;
}

Assistant:

bool RenX::Server::smodePlayer(const RenX::PlayerInfo &player) {
	return send(string_printf("smode pid%d", player.id));
}